

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int sftp_unlink(LIBSSH2_SFTP *sftp,char *filename,size_t filename_len)

{
  int iVar1;
  ulong uVar2;
  ssize_t nwritten;
  uchar *puStack_58;
  int rc;
  uchar *data;
  uchar *s;
  uint32_t packet_len;
  uint32_t retcode;
  size_t data_len;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel;
  size_t filename_len_local;
  char *filename_local;
  LIBSSH2_SFTP *sftp_local;
  
  session = (LIBSSH2_SESSION *)sftp->channel;
  data_len = (size_t)session->kex_prefs;
  _packet_len = 0;
  s._0_4_ = (int)filename_len + 0xd;
  puStack_58 = (uchar *)0x0;
  channel = (LIBSSH2_CHANNEL *)filename_len;
  filename_len_local = (size_t)filename;
  filename_local = (char *)sftp;
  if (sftp->unlink_state == libssh2_NB_state_idle) {
    sftp->last_errno = 0;
    data = (uchar *)(*((LIBSSH2_SESSION *)data_len)->alloc)((size_t)(uint)s,(void **)data_len);
    *(uchar **)(filename_local + 0xe8) = data;
    if (*(long *)(filename_local + 0xe8) == 0) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_len,-6,
                             "Unable to allocate memory for FXP_REMOVE packet");
      return iVar1;
    }
    _libssh2_store_u32(&data,(uint)s - 4);
    *data = '\r';
    iVar1 = *(int *)(filename_local + 8);
    *(int *)(filename_local + 8) = iVar1 + 1;
    *(int *)(filename_local + 0xf0) = iVar1;
    data = data + 1;
    _libssh2_store_u32(&data,*(uint32_t *)(filename_local + 0xf0));
    _libssh2_store_str(&data,(char *)filename_len_local,(size_t)channel);
    filename_local[0xe4] = '\x02';
    filename_local[0xe5] = '\0';
    filename_local[0xe6] = '\0';
    filename_local[0xe7] = '\0';
  }
  if (*(int *)(filename_local + 0xe4) == 2) {
    uVar2 = _libssh2_channel_write
                      ((LIBSSH2_CHANNEL *)session,0,*(uchar **)(filename_local + 0xe8),
                       (ulong)(uint)s);
    if (uVar2 == 0xffffffffffffffdb) {
      return -0x25;
    }
    if ((uint)s != uVar2) {
      (**(code **)(data_len + 0x18))(*(undefined8 *)(filename_local + 0xe8),data_len);
      filename_local[0xe8] = '\0';
      filename_local[0xe9] = '\0';
      filename_local[0xea] = '\0';
      filename_local[0xeb] = '\0';
      filename_local[0xec] = '\0';
      filename_local[0xed] = '\0';
      filename_local[0xee] = '\0';
      filename_local[0xef] = '\0';
      filename_local[0xe4] = '\0';
      filename_local[0xe5] = '\0';
      filename_local[0xe6] = '\0';
      filename_local[0xe7] = '\0';
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_len,-7,"Unable to send FXP_REMOVE command");
      return iVar1;
    }
    (**(code **)(data_len + 0x18))(*(undefined8 *)(filename_local + 0xe8),data_len);
    filename_local[0xe8] = '\0';
    filename_local[0xe9] = '\0';
    filename_local[0xea] = '\0';
    filename_local[0xeb] = '\0';
    filename_local[0xec] = '\0';
    filename_local[0xed] = '\0';
    filename_local[0xee] = '\0';
    filename_local[0xef] = '\0';
    filename_local[0xe4] = '\x03';
    filename_local[0xe5] = '\0';
    filename_local[0xe6] = '\0';
    filename_local[0xe7] = '\0';
  }
  iVar1 = sftp_packet_require((LIBSSH2_SFTP *)filename_local,'e',
                              *(uint32_t *)(filename_local + 0xf0),&stack0xffffffffffffffa8,
                              (size_t *)&packet_len,9);
  if (iVar1 == -0x25) {
    sftp_local._4_4_ = -0x25;
  }
  else if (iVar1 == -0x26) {
    if (_packet_len != 0) {
      (**(code **)(data_len + 0x18))(puStack_58,data_len);
    }
    sftp_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"SFTP unlink packet too short");
  }
  else if (iVar1 == 0) {
    filename_local[0xe4] = '\0';
    filename_local[0xe5] = '\0';
    filename_local[0xe6] = '\0';
    filename_local[0xe7] = '\0';
    s._4_4_ = _libssh2_ntohu32(puStack_58 + 5);
    (**(code **)(data_len + 0x18))(puStack_58,data_len);
    if (s._4_4_ == 0) {
      sftp_local._4_4_ = 0;
    }
    else {
      *(uint32_t *)(filename_local + 0x48) = s._4_4_;
      sftp_local._4_4_ = _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"SFTP Protocol Error");
    }
  }
  else {
    filename_local[0xe4] = '\0';
    filename_local[0xe5] = '\0';
    filename_local[0xe6] = '\0';
    filename_local[0xe7] = '\0';
    sftp_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)data_len,iVar1,"Error waiting for FXP STATUS");
  }
  return sftp_local._4_4_;
}

Assistant:

static int sftp_unlink(LIBSSH2_SFTP *sftp, const char *filename,
                       size_t filename_len)
{
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    size_t data_len = 0;
    uint32_t retcode;
    /* 13 = packet_len(4) + packet_type(1) + request_id(4) + filename_len(4) */
    uint32_t packet_len = (uint32_t)(filename_len + 13);
    unsigned char *s, *data = NULL;
    int rc;

    if(sftp->unlink_state == libssh2_NB_state_idle) {
        sftp->last_errno = LIBSSH2_FX_OK;

        _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                       "Unlinking %s", filename));
        s = sftp->unlink_packet = LIBSSH2_ALLOC(session, packet_len);
        if(!sftp->unlink_packet) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for FXP_REMOVE "
                                  "packet");
        }

        _libssh2_store_u32(&s, packet_len - 4);
        *(s++) = SSH_FXP_REMOVE;
        sftp->unlink_request_id = sftp->request_id++;
        _libssh2_store_u32(&s, sftp->unlink_request_id);
        _libssh2_store_str(&s, filename, filename_len);
        sftp->unlink_state = libssh2_NB_state_created;
    }

    if(sftp->unlink_state == libssh2_NB_state_created) {
        ssize_t nwritten;
        nwritten = _libssh2_channel_write(channel, 0, sftp->unlink_packet,
                                          packet_len);
        if(nwritten == LIBSSH2_ERROR_EAGAIN) {
            return (int)nwritten;
        }
        else if((ssize_t)packet_len != nwritten) {
            LIBSSH2_FREE(session, sftp->unlink_packet);
            sftp->unlink_packet = NULL;
            sftp->unlink_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "Unable to send FXP_REMOVE command");
        }
        LIBSSH2_FREE(session, sftp->unlink_packet);
        sftp->unlink_packet = NULL;

        sftp->unlink_state = libssh2_NB_state_sent;
    }

    rc = sftp_packet_require(sftp, SSH_FXP_STATUS,
                             sftp->unlink_request_id, &data,
                             &data_len, 9);
    if(rc == LIBSSH2_ERROR_EAGAIN) {
        return rc;
    }
    else if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
        if(data_len > 0) {
            LIBSSH2_FREE(session, data);
        }
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP unlink packet too short");
    }
    else if(rc) {
        sftp->unlink_state = libssh2_NB_state_idle;
        return _libssh2_error(session, rc,
                              "Error waiting for FXP STATUS");
    }

    sftp->unlink_state = libssh2_NB_state_idle;

    retcode = _libssh2_ntohu32(data + 5);
    LIBSSH2_FREE(session, data);

    if(retcode == LIBSSH2_FX_OK) {
        return 0;
    }
    else {
        sftp->last_errno = retcode;
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP Protocol Error");
    }
}